

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paf_parser_test.cpp
# Opt level: O2

void __thiscall bioparser::test::BioparserPafTest::Check(BioparserPafTest *this)

{
  char *pcVar1;
  AssertHelper local_38;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  AssertionResult gtest_ar;
  
  local_38.data_._0_4_ = 500;
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)(this->o).
              super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->o).
              super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"500","o.size()",(int *)&local_38,(unsigned_long *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/paf_parser_test.cpp"
               ,0x3a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_30._M_head_impl._0_4_ = 0x178de;
  local_38.data_._0_4_ =
       std::
       accumulate<__gnu_cxx::__normal_iterator<std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>*,std::vector<std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>,std::allocator<std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>>>>,int,bioparser::test::BioparserPafTest::Check()::_lambda(unsigned_int,std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>const&)_1_>
                 ((this->o).
                  super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (this->o).
                  super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"96478",
             "std::accumulate(o.begin(), o.end(), 0, [] (std::uint32_t s, const std::unique_ptr<PafOverlap>& it) { return s + it->q_name.size() + it->t_name.size(); })"
             ,(int *)&local_30,(int *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/paf_parser_test.cpp"
               ,0x3e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_30._M_head_impl._0_4_ = 0x119de3a;
  local_38.data_._0_4_ =
       std::
       accumulate<__gnu_cxx::__normal_iterator<std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>*,std::vector<std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>,std::allocator<std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>>>>,int,bioparser::test::BioparserPafTest::Check()::_lambda(unsigned_int,std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>const&)_2_>
                 ((this->o).
                  super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (this->o).
                  super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"18472506",
             "std::accumulate(o.begin(), o.end(), 0, [] (std::uint32_t s, const std::unique_ptr<PafOverlap>& it) { return s + it->lhs_id + it->lhs_begin + it->lhs_end + it->q_len + it->rhs_id + it->rhs_begin + it->rhs_end + it->t_len + it->score + it->strand + it->overlap_len + it->quality; })"
             ,(int *)&local_30,(int *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/paf_parser_test.cpp"
               ,0x48,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void Check() {
    EXPECT_EQ(500, o.size());
    EXPECT_EQ(96478, std::accumulate(o.begin(), o.end(), 0,
        [] (std::uint32_t s, const std::unique_ptr<PafOverlap>& it) {
          return s + it->q_name.size() + it->t_name.size();
        }));
    EXPECT_EQ(18472506, std::accumulate(o.begin(), o.end(), 0,
        [] (std::uint32_t s, const std::unique_ptr<PafOverlap>& it) {
          return s +
              it->lhs_id + it->lhs_begin + it->lhs_end + it->q_len +
              it->rhs_id + it->rhs_begin + it->rhs_end + it->t_len +
              it->score +
              it->strand +
              it->overlap_len +
              it->quality;
        }));
  }